

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  long *__src;
  secp256k1_context *prealloc_00;
  secp256k1_context *psVar5;
  secp256k1_context *in_RCX;
  secp256k1_gej *extraout_RDX;
  secp256k1_gej *extraout_RDX_00;
  secp256k1_gej *extraout_RDX_01;
  secp256k1_gej *extraout_RDX_02;
  secp256k1_gej *psVar6;
  uchar *p1;
  secp256k1_sha256 *psVar7;
  uint flags_00;
  int iVar8;
  byte bVar9;
  uchar out [32];
  secp256k1_sha256 hasher;
  secp256k1_gej local_128;
  secp256k1_sha256 local_a8;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  
  bVar9 = 0;
  local_a8.s[0] = 0x6a09e667;
  local_a8.s[1] = 0xbb67ae85;
  local_a8.s[2] = 0x3c6ef372;
  local_a8.s[3] = 0xa54ff53a;
  local_a8.s[4] = 0x510e527f;
  local_a8.s[5] = 0x9b05688c;
  local_a8.s[6] = 0x1f83d9ab;
  local_a8.s[7] = 0x5be0cd19;
  local_a8.bytes = 0;
  secp256k1_sha256_write
            (&local_a8,(uchar *)"For this sample, this 63-byte string will be used as input data",
             0x3f);
  secp256k1_sha256_finalize(&local_a8,(uchar *)&local_128);
  lVar3 = 0;
  do {
    psVar5 = (secp256k1_context *)((ulong)in_RCX & 0xffffffff);
    bVar1 = *(byte *)((long)local_128.x.n + lVar3);
    flags_00 = (uint)bVar1;
    bVar2 = (&secp256k1_selftest_sha256_output32)[lVar3];
    in_RCX = (secp256k1_context *)(ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      in_RCX = psVar5;
    }
    iVar8 = (int)in_RCX;
    if (bVar1 != bVar2) goto LAB_003ca8bf;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  iVar8 = 0;
LAB_003ca8bf:
  if (iVar8 == 0) {
    sVar4 = secp256k1_context_preallocated_size(flags);
    if (sVar4 == 0) {
      prealloc = (secp256k1_context *)0x0;
    }
    else {
      *(secp256k1_callback *)((long)prealloc + 0xb8) = default_illegal_callback;
      *(secp256k1_callback *)((long)prealloc + 200) = default_error_callback;
      *(undefined8 *)prealloc = 0;
      *(undefined8 *)((long)prealloc + 8) = 0;
      *(undefined8 *)((long)prealloc + 0x10) = 0;
      psVar6 = extraout_RDX;
      if ((flags >> 9 & 1) != 0) {
        *(secp256k1_ge_storage (**) [16])((long)prealloc + 0x10) = secp256k1_ecmult_static_context;
        secp256k1_ecmult_gen_blind
                  ((secp256k1_ecmult_gen_context *)((long)prealloc + 0x10),(uchar *)0x0);
        psVar6 = extraout_RDX_00;
      }
      if (((flags >> 8 & 1) != 0) && (*prealloc == 0)) {
        local_30 = 0;
        local_a8.s[0] = 0x16f81798;
        local_a8.s[1] = 0x2815b;
        local_a8.s[2] = 0xe28d959f;
        local_a8.s[3] = 0xdb2dc;
        local_a8.s[4] = 0x7029bfc;
        local_a8.s[5] = 0xe870b;
        local_a8.s[6] = 0x5a06295c;
        local_a8.s[7] = 0xbbac5;
        local_a8.buf[0] = 0x667ef9dc;
        local_a8.buf[1] = 0x79be;
        local_a8.buf[2] = 0xfb10d4b8;
        local_a8.buf[3] = 0x7d08f;
        local_a8.buf[4] = 0x554199c4;
        local_a8.buf[5] = 0x48a68;
        local_a8.buf[6] = 0xa8fd17b4;
        local_a8.buf[7] = 0xe1108;
        local_a8.buf[8] = 0xda4fbfc0;
        local_a8.buf[9] = 0xc4655;
        local_a8.buf[10] = 0xda7726a3;
        local_a8.buf[0xb] = 0x483a;
        local_a8.buf[0xc] = 1;
        local_a8.buf[0xd] = 0;
        local_a8.buf[0xe] = 0;
        local_a8.buf[0xf] = 0;
        local_a8.bytes = 0;
        local_40 = 0;
        uStack_38 = 0;
        *(long *)prealloc = (long)prealloc + 0xe0;
        secp256k1_ecmult_odd_multiples_table_storage_var
                  ((int)((long)prealloc + 0xe0),(secp256k1_ge_storage *)&local_a8,psVar6);
        *(long *)((long)prealloc + 8) = (long)prealloc + 0x800e0;
        psVar7 = &local_a8;
        psVar6 = &local_128;
        for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
          *(uint64_t *)psVar6 = ((secp256k1_fe_storage *)psVar7->s)->n[0];
          psVar7 = (secp256k1_sha256 *)((long)psVar7 + (ulong)bVar9 * -0x10 + 8);
          psVar6 = (secp256k1_gej *)((long)psVar6 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        iVar8 = 0x80;
        psVar6 = extraout_RDX_01;
        do {
          if (local_128.infinity == 0) {
            secp256k1_gej_double(&local_128,&local_128);
            psVar6 = extraout_RDX_02;
          }
          else {
            local_128.infinity = 1;
          }
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        secp256k1_ecmult_odd_multiples_table_storage_var
                  ((int)*(undefined8 *)((long)prealloc + 8),(secp256k1_ge_storage *)&local_128,
                   psVar6);
      }
      *(uint *)((long)prealloc + 0xd8) = flags >> 10 & 1;
    }
    return (secp256k1_context *)prealloc;
  }
  secp256k1_context_preallocated_create_cold_1();
  __src = (long *)secp256k1_context_preallocated_size(flags_00);
  prealloc_00 = (secp256k1_context *)malloc((size_t)__src);
  if (prealloc_00 != (secp256k1_context *)0x0) {
    psVar5 = secp256k1_context_preallocated_create(prealloc_00,flags_00);
    if (psVar5 == (secp256k1_context *)0x0) {
      free(prealloc_00);
      prealloc_00 = (secp256k1_context *)0x0;
    }
    return prealloc_00;
  }
  secp256k1_context_create_cold_1();
  if (psVar5 == (secp256k1_context *)0x0) {
    secp256k1_context_preallocated_clone_cold_1();
    psVar5 = (secp256k1_context *)0x0;
  }
  else {
    memcpy(psVar5,__src,(ulong)(*__src != 0) << 0x14 | 0xe0);
    if (*__src != 0) {
      (psVar5->ecmult_ctx).pre_g =
           (secp256k1_ge_storage_0_ *)((*__src - (long)__src) + (long)psVar5);
    }
    if (__src[1] != 0) {
      (psVar5->ecmult_ctx).pre_g_128 =
           (secp256k1_ge_storage_0_ *)((__src[1] - (long)__src) + (long)psVar5);
    }
  }
  return psVar5;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    void* const base = prealloc;
    size_t prealloc_size;
    secp256k1_context* ret;

    if (!secp256k1_selftest()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)manual_alloc(&prealloc, sizeof(secp256k1_context), base, prealloc_size);
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    secp256k1_ecmult_context_init(&ret->ecmult_ctx);
    secp256k1_ecmult_gen_context_init(&ret->ecmult_gen_ctx);

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx, &prealloc);
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        secp256k1_ecmult_context_build(&ret->ecmult_ctx, &prealloc);
    }
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return (secp256k1_context*) ret;
}